

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# apply.c
# Opt level: O0

int use_whip(obj *obj)

{
  level *obj_00;
  boolean bVar1;
  schar sVar2;
  int iVar3;
  int iVar4;
  char *pcVar5;
  char *pcVar6;
  obj *poVar7;
  undefined8 uVar8;
  bool bVar9;
  monst *local_480;
  char local_478 [8];
  char premsg [256];
  char kbuf [256];
  char *pcStack_270;
  boolean gotit;
  char *mon_hand;
  char onambuf [256];
  coord local_15a;
  char *pcStack_158;
  coord cc;
  char *wrapped_what;
  int dam;
  schar dz;
  schar dy;
  schar dx;
  char *msg_snap;
  char *msg_slipsfree;
  int res;
  int proficient;
  int ry;
  int rx;
  obj *otmp;
  monst *mtmp;
  char buf [256];
  obj *obj_local;
  
  msg_slipsfree._0_4_ = 0;
  msg_snap = "The bullwhip slips free.";
  _dam = "Snap!";
  buf._248_8_ = obj;
  if (obj != uwep) {
    bVar1 = wield_tool(obj,"lash");
    if (bVar1 == '\0') {
      return 0;
    }
    msg_slipsfree._0_4_ = 1;
  }
  iVar3 = getdir((char *)0x0,(schar *)((long)&wrapped_what + 7),(schar *)((long)&wrapped_what + 6),
                 (schar *)((long)&wrapped_what + 5));
  if (iVar3 == 0) {
    return (int)msg_slipsfree;
  }
  if ((((u.uprops[0x1b].intrinsic != 0) || (u.umonnum == 0x9e)) || ((youmonst.data)->mlet == '\x1c')
      ) || ((u.uprops[0x1c].intrinsic != 0 && (iVar3 = rn2(5), iVar3 == 0)))) {
    confdir((schar *)((long)&wrapped_what + 7),(schar *)((long)&wrapped_what + 6));
  }
  proficient = (int)u.ux + (int)wrapped_what._7_1_;
  res = (int)u.uy + (int)wrapped_what._6_1_;
  if ((level->monsters[proficient][res] == (monst *)0x0) ||
     ((*(uint *)&level->monsters[proficient][res]->field_0x60 >> 9 & 1) != 0)) {
    local_480 = (monst *)0x0;
  }
  else {
    local_480 = level->monsters[proficient][res];
  }
  otmp = (obj *)local_480;
  msg_slipsfree._4_4_ = (uint)(urole.malenum == 0x159);
  sVar2 = acurr(3);
  if (sVar2 < '\x06') {
    msg_slipsfree._4_4_ = msg_slipsfree._4_4_ - 1;
  }
  else {
    sVar2 = acurr(3);
    if ('\r' < sVar2) {
      sVar2 = acurr(3);
      msg_slipsfree._4_4_ = sVar2 + -0xe + msg_slipsfree._4_4_;
    }
  }
  if ((u.uprops[0x25].intrinsic != 0) || (u.uprops[0x25].extrinsic != 0)) {
    msg_slipsfree._4_4_ = msg_slipsfree._4_4_ - 1;
  }
  if (3 < (int)msg_slipsfree._4_4_) {
    msg_slipsfree._4_4_ = 3;
  }
  if ((int)msg_slipsfree._4_4_ < 0) {
    msg_slipsfree._4_4_ = 0;
  }
  if (((u._1052_1_ & 1) != 0) &&
     (bVar1 = attack(u.ustuck,wrapped_what._7_1_,wrapped_what._6_1_), bVar1 != '\0')) {
    pline("There is not enough room to flick your bullwhip.");
    return 1;
  }
  if (((byte)u._1052_1_ >> 1 & 1) != 0) {
    pline("There is too much resistance to flick your bullwhip.");
    return 1;
  }
  if (wrapped_what._5_1_ < '\0') {
    pcVar5 = ceiling((int)u.ux,(int)u.uy);
    pline("You flick a bug off of the %s.",pcVar5);
    return 1;
  }
  if (((wrapped_what._7_1_ == '\0') && (wrapped_what._6_1_ == '\0')) || ('\0' < wrapped_what._5_1_))
  {
    if ((u.usteed != (monst *)0x0) && (iVar3 = rn2(msg_slipsfree._4_4_ + 2), iVar3 == 0)) {
      pcVar5 = mon_nam(u.usteed);
      pline("You whip %s!",pcVar5);
      kick_steed();
      return 1;
    }
    if (((u.uprops[0x12].intrinsic != 0) || (u.uprops[0x12].extrinsic != 0)) ||
       (((youmonst.data)->mlet == '\x05' || (u.usteed != (monst *)0x0)))) {
      _ry = (level *)level->objects[u.ux][u.uy];
      if (((_ry != (level *)0x0) && (((obj *)_ry)->otyp == 0x10e)) &&
         (((obj *)_ry)->corpsenm == 0x6c)) {
        pline("Why beat a dead horse?");
        return 1;
      }
      if ((_ry != (level *)0x0) && (msg_slipsfree._4_4_ != 0)) {
        pcVar5 = singular((obj *)_ry,xname);
        pcVar5 = an(pcVar5);
        pcVar6 = surface((int)u.ux,(int)u.uy);
        pline("You wrap your bullwhip around %s on the %s.",pcVar5,pcVar6);
        iVar3 = rnl(6);
        if ((iVar3 != 0) || (iVar3 = pickup_object((obj *)_ry,1,'\x01'), iVar3 < 1)) {
          pline(msg_snap);
        }
        return 1;
      }
    }
    iVar3 = rnd(2);
    iVar4 = dbon();
    wrapped_what._0_4_ = iVar3 + iVar4 + (int)*(char *)(buf._248_8_ + 0x34);
    if ((int)wrapped_what < 1) {
      wrapped_what._0_4_ = 1;
    }
    pcVar5 = body_part(5);
    pline("You hit your %s with your bullwhip.",pcVar5);
    sprintf((char *)&mtmp,"killed %sself with %s bullwhip",
            genders[(int)(uint)(flags.female != '\0')].him,
            genders[(int)(uint)(flags.female != '\0')].his);
    losehp((int)wrapped_what,(char *)&mtmp,2);
    iflags.botl = '\x01';
    return 1;
  }
  if ((((u.uprops[0x25].intrinsic != 0) || (u.uprops[0x25].extrinsic != 0)) ||
      (u.uprops[0x29].intrinsic != 0)) && (iVar3 = rn2(5), iVar3 == 0)) {
    pcVar5 = body_part(6);
    pline("The bullwhip slips out of your %s.",pcVar5);
    dropx((obj *)buf._248_8_);
    return 1;
  }
  if ((u.utrap != 0) && (u.utraptype == 1)) {
    pcStack_158 = (char *)0x0;
    if (otmp != (obj *)0x0) {
      if (*(byte *)((long)&((otmp->v).v_nexthere)->owt + 3) < 3) {
        if (msg_slipsfree._4_4_ != 0) {
          bVar1 = attack((monst *)otmp,wrapped_what._7_1_,wrapped_what._6_1_);
          if (bVar1 != '\0') {
            return 1;
          }
          pline(_dam);
        }
      }
      else {
        pcVar5 = mon_nam((monst *)otmp);
        pcStack_158 = strcpy((char *)&mtmp,pcVar5);
      }
    }
    if (pcStack_158 == (char *)0x0) {
      if ((level->locations[proficient][res].typ < '\x1a') ||
         ('!' < level->locations[proficient][res].typ)) {
        poVar7 = sobj_at(0x214,level,proficient,res);
        if (poVar7 != (obj *)0x0) {
          pcStack_158 = "a boulder";
        }
      }
      else {
        pcStack_158 = "something";
      }
    }
    if (pcStack_158 != (char *)0x0) {
      local_15a.x = (xchar)proficient;
      local_15a.y = (xchar)res;
      pline("You wrap your bullwhip around %s.",pcStack_158);
      if ((msg_slipsfree._4_4_ == 0) || (iVar3 = rn2(msg_slipsfree._4_4_ + 2), iVar3 == 0)) {
        pline(msg_snap);
      }
      else if ((otmp == (obj *)0x0) ||
              (bVar1 = enexto(&local_15a,level,(xchar)proficient,(xchar)res,youmonst.data),
              bVar1 != '\0')) {
        pline("You yank yourself out of the pit!");
        teleds((int)local_15a.x,(int)local_15a.y,'\x01');
        u.utrap = 0;
        vision_full_recalc = '\x01';
      }
      if (otmp == (obj *)0x0) {
        return 1;
      }
      wakeup((monst *)otmp);
      return 1;
    }
    pline(_dam);
    return 1;
  }
  if (otmp == (obj *)0x0) {
    bVar1 = on_level(&u.uz,&dungeon_topology.d_air_level);
    if ((bVar1 == '\0') && (bVar1 = on_level(&u.uz,&dungeon_topology.d_water_level), bVar1 == '\0'))
    {
      pline(_dam);
      return 1;
    }
    pline("You snap your whip through thin air.");
    return 1;
  }
  if (*(char *)((long)otmp->oextra + 1) == '\0') {
    if (((viz_array[(char)otmp->corpsenm][(char)otmp->field_0x4f] & 2U) != 0) ||
       ((((u.uprops[0x1e].intrinsic == 0 &&
          (((ublindf == (obj *)0x0 || (ublindf->otyp == 0xed)) &&
           (((youmonst.data)->mflags1 & 0x1000) == 0)))) ||
         ((ublindf != (obj *)0x0 && (ublindf->oartifact == '\x1d')))) &&
        (((u.uprops[0x40].intrinsic != 0 ||
          ((u.uprops[0x40].extrinsic != 0 || (((youmonst.data)->mflags3 & 0x100) != 0)))) &&
         (((((otmp->v).v_nexthere)->oprops & 0x200) != 0 &&
          ((viz_array[(char)otmp->corpsenm][(char)otmp->field_0x4f] & 1U) != 0))))))))
    goto LAB_0014c39c;
LAB_0014c432:
    if (((((((otmp->v).v_nexthere)->quan & 0x10000U) != 0) ||
         ((poVar7 = which_armor((monst *)otmp,4), poVar7 != (obj *)0x0 &&
          (poVar7 = which_armor((monst *)otmp,4), poVar7->otyp == 0x4f)))) ||
        ((((u.uprops[0x1e].intrinsic == 0 &&
           (((ublindf == (obj *)0x0 || (ublindf->otyp == 0xed)) &&
            (((youmonst.data)->mflags1 & 0x1000) == 0)))) ||
          (((ublindf != (obj *)0x0 && (ublindf->oartifact == '\x1d')) ||
           (((((u.uprops[0x19].intrinsic == 0 &&
               ((u.uprops[0x19].extrinsic == 0 && (youmonst.data != mons + 0x1e)))) &&
              (youmonst.data != mons + 0x31)) && (youmonst.data != mons + 0x32)) ||
            (u.uprops[0x19].blocked != 0)))))) &&
         (((u.uprops[0x19].extrinsic == 0 || (u.uprops[0x19].blocked != 0)) ||
          (iVar3 = dist2((int)(char)otmp->field_0x4f,(int)(char)otmp->corpsenm,(int)u.ux,(int)u.uy),
          0x40 < iVar3)))))) &&
       (((u.uprops[0x42].intrinsic == 0 && (u.uprops[0x42].extrinsic == 0)) &&
        ((bVar1 = match_warn_of_mon((monst *)otmp), bVar1 == '\0' &&
         ((*(uint *)&level->locations[proficient][res].field_0x6 >> 3 & 1) == 0)))))) {
      pline("A monster is there that you couldn\'t see.");
      map_invisible((xchar)proficient,(xchar)res);
    }
  }
  else {
    bVar1 = worm_known(level,(monst *)otmp);
    if (bVar1 == '\0') goto LAB_0014c432;
LAB_0014c39c:
    if ((((((((uint)otmp->owornmask >> 1 & 1) != 0) && (u.uprops[0xc].intrinsic == 0)) &&
          (u.uprops[0xc].extrinsic == 0)) && (((youmonst.data)->mflags1 & 0x1000000) == 0)) ||
        ((((uint)otmp->owornmask >> 7 & 1) != 0 || (((uint)otmp->owornmask >> 9 & 1) != 0)))) ||
       (((byte)u._1052_1_ >> 5 & 1) != 0)) goto LAB_0014c432;
  }
  _ry = otmp->olev;
  if (_ry == (level *)0x0) {
    if (((((otmp->field_0x59 == '\0') || (u.uprops[0x17].intrinsic != 0)) ||
         (u.uprops[0x17].extrinsic != 0)) ||
        ((((((otmp->v).v_nexthere)->quan & 0x10000U) == 0 &&
          ((poVar7 = which_armor((monst *)otmp,4), poVar7 == (obj *)0x0 ||
           (poVar7 = which_armor((monst *)otmp,4), poVar7->otyp != 0x4f)))) &&
         (((((u.uprops[0x1e].intrinsic != 0 ||
             (((ublindf != (obj *)0x0 && (ublindf->otyp != 0xed)) ||
              (((youmonst.data)->mflags1 & 0x1000) != 0)))) &&
            (((ublindf == (obj *)0x0 || (ublindf->oartifact != '\x1d')) &&
             ((((u.uprops[0x19].intrinsic != 0 ||
                ((u.uprops[0x19].extrinsic != 0 || (youmonst.data == mons + 0x1e)))) ||
               (youmonst.data == mons + 0x31)) || (youmonst.data == mons + 0x32)))))) &&
           (u.uprops[0x19].blocked == 0)) ||
          (((u.uprops[0x19].extrinsic != 0 && (u.uprops[0x19].blocked == 0)) &&
           (iVar3 = dist2((int)(char)otmp->field_0x4f,(int)(char)otmp->corpsenm,(int)u.ux,(int)u.uy)
           , iVar3 < 0x41)))))))) ||
       (((u.uprops[0x42].intrinsic != 0 || (u.uprops[0x42].extrinsic != 0)) ||
        (bVar1 = match_warn_of_mon((monst *)otmp), bVar1 != '\0')))) {
      pcVar5 = mon_nam((monst *)otmp);
      pline("You flick your bullwhip towards %s.",pcVar5);
    }
    else {
      stumble_onto_mimic((monst *)otmp,wrapped_what._7_1_,wrapped_what._6_1_);
    }
    if (msg_slipsfree._4_4_ == 0) {
      return 1;
    }
    bVar1 = attack((monst *)otmp,wrapped_what._7_1_,wrapped_what._6_1_);
    if (bVar1 == '\0') {
      pline(_dam);
      return 1;
    }
    return 1;
  }
  bVar9 = false;
  if ((msg_slipsfree._4_4_ != 0) &&
     ((u.uprops[0x25].intrinsic != 0 || (bVar9 = true, u.uprops[0x25].extrinsic != 0)))) {
    iVar3 = rn2(10);
    bVar9 = iVar3 == 0;
  }
  pcVar5 = cxname((obj *)_ry);
  strcpy((char *)&mon_hand,pcVar5);
  if (bVar9) {
    pcStack_270 = mbodypart((monst *)otmp,6);
    if (((*(char *)((long)_ry->levname + 0x35) == '\x02') ||
        (*(char *)((long)_ry->levname + 0x35) == '\x06')) &&
       ((*(ushort *)&objects[*(short *)((long)_ry->levname + 0x2a)].field_0x11 & 1) != 0)) {
      pcStack_270 = makeplural(pcStack_270);
    }
  }
  else {
    pcStack_270 = (char *)0x0;
  }
  pcVar5 = mon_nam((monst *)otmp);
  pcVar5 = s_suffix(pcVar5);
  pline("You wrap your bullwhip around %s %s.",pcVar5,&mon_hand);
  if ((bVar9) && ((*(uint *)&_ry->locations[0][0].field_0xa & 1) != 0)) {
    pcVar5 = "They are";
    if (*(int *)((long)_ry->levname + 0x30) == 1) {
      pcVar5 = "It is";
    }
    iVar3 = pronoun_gender(level,(monst *)otmp);
    uVar8 = 0x2e;
    if ((*(uint *)&_ry->locations[0][0].field_0xa >> 6 & 1) == 0) {
      uVar8 = 0x21;
    }
    pline("%s welded to %s %s%c",pcVar5,genders[iVar3].his,pcStack_270,uVar8);
    *(uint *)&_ry->locations[0][0].field_0xa =
         *(uint *)&_ry->locations[0][0].field_0xa & 0xffffffbf | 0x40;
    bVar9 = false;
  }
  if (bVar9) {
    obj_extract_self((obj *)_ry);
    possibly_unwield((monst *)otmp,'\0');
    setmnotwielded((monst *)otmp,(obj *)_ry);
    iVar3 = rn2(msg_slipsfree._4_4_ + 1);
    if (iVar3 == 2) {
      pcVar5 = mon_nam((monst *)otmp);
      pcVar5 = s_suffix(pcVar5);
      pcVar6 = surface((int)u.ux,(int)u.uy);
      pline("You yank %s %s to the %s!",pcVar5,&mon_hand,pcVar6);
      place_object((obj *)_ry,level,(int)u.ux,(int)u.uy);
      stackobj((obj *)_ry);
    }
    else if (iVar3 == 3) {
      pcVar5 = mon_nam((monst *)otmp);
      pcVar5 = s_suffix(pcVar5);
      pline("You snatch %s %s!",pcVar5,&mon_hand);
      if ((((*(short *)((long)_ry->levname + 0x2a) == 0x10e) &&
           ((((long)*(int *)&_ry->locations[0][1].typ & 0x3ffffffffffffffU) == 0xc ||
            (((long)*(int *)&_ry->locations[0][1].typ & 0x3ffffffffffffffU) == 0xb)))) &&
          (uarmg == (obj *)0x0)) &&
         (((u.uprops[8].extrinsic == 0 && ((youmonst.mintrinsics & 0x80) == 0)) &&
          ((bVar1 = poly_when_stoned(youmonst.data), bVar1 == '\0' ||
           (iVar3 = polymon(0x108), iVar3 == 0)))))) {
        pcVar5 = mons_mname(mons + *(int *)&_ry->locations[0][1].typ);
        pcVar5 = an(pcVar5);
        sprintf(premsg + 0xf8,"%s corpse",pcVar5);
        sprintf(local_478,"Snatching %s is a fatal mistake.",premsg + 0xf8);
        bVar1 = delayed_petrify(local_478,premsg + 0xf8);
        if (bVar1 != '\0') {
          pcVar5 = doname((obj *)_ry);
          pline("You drop %s!",pcVar5);
          dropy((obj *)_ry);
          goto LAB_0014cc50;
        }
      }
      obj_00 = _ry;
      pcVar5 = doname((obj *)_ry);
      hold_another_object((obj *)obj_00,"You drop %s!",pcVar5,(char *)0x0);
    }
    else {
      pcVar5 = the((char *)&mon_hand);
      pcVar6 = mon_nam((monst *)otmp);
      pcVar6 = s_suffix(pcVar6);
      pline("You yank %s from %s %s!",pcVar5,pcVar6,pcStack_270);
      obj_no_longer_held((obj *)_ry);
      place_object((obj *)_ry,level,(int)(char)otmp->field_0x4f,(int)(char)otmp->corpsenm);
      stackobj((obj *)_ry);
    }
  }
  else {
    pline(msg_snap);
  }
LAB_0014cc50:
  wakeup((monst *)otmp);
  return 1;
}

Assistant:

static int use_whip(struct obj *obj)
{
    char buf[BUFSZ];
    struct monst *mtmp;
    struct obj *otmp;
    int rx, ry, proficient, res = 0;
    const char *msg_slipsfree = "The bullwhip slips free.";
    const char *msg_snap = "Snap!";
    schar dx, dy, dz;

    if (obj != uwep) {
	if (!wield_tool(obj, "lash")) return 0;
	else res = 1;
    }
    
    if (!getdir(NULL, &dx, &dy, &dz))
	return res;

    if (Stunned || (Confusion && !rn2(5)))
	confdir(&dx, &dy);
    rx = u.ux + dx;
    ry = u.uy + dy;
    mtmp = m_at(level, rx, ry);

    /* fake some proficiency checks */
    proficient = 0;
    if (Role_if (PM_ARCHEOLOGIST)) ++proficient;
    if (ACURR(A_DEX) < 6) proficient--;
    else if (ACURR(A_DEX) >= 14) proficient += (ACURR(A_DEX) - 14);
    if (Fumbling) --proficient;
    if (proficient > 3) proficient = 3;
    if (proficient < 0) proficient = 0;

    if (u.uswallow && attack(u.ustuck, dx, dy)) {
	pline("There is not enough room to flick your bullwhip.");

    } else if (Underwater) {
	pline("There is too much resistance to flick your bullwhip.");

    } else if (dz < 0) {
	pline("You flick a bug off of the %s.",ceiling(u.ux,u.uy));

    } else if ((!dx && !dy) || (dz > 0)) {
	int dam;

	/* Sometimes you hit your steed by mistake */
	if (u.usteed && !rn2(proficient + 2)) {
	    pline("You whip %s!", mon_nam(u.usteed));
	    kick_steed();
	    return 1;
	}

	if (Levitation || u.usteed) {
	    /* Have a shot at snaring something on the floor */
	    otmp = level->objects[u.ux][u.uy];
	    if (otmp && otmp->otyp == CORPSE && otmp->corpsenm == PM_HORSE) {
		pline("Why beat a dead horse?");
		return 1;
	    }
	    if (otmp && proficient) {
		pline("You wrap your bullwhip around %s on the %s.",
		    an(singular(otmp, xname)), surface(u.ux, u.uy));
		if (rnl(6) || pickup_object(otmp, 1L, TRUE) < 1)
		    pline(msg_slipsfree);
		return 1;
	    }
	}
	dam = rnd(2) + dbon() + obj->spe;
	if (dam <= 0)
	    dam = 1;
	pline("You hit your %s with your bullwhip.", body_part(FOOT));
	sprintf(buf, "killed %sself with %s bullwhip", uhim(), uhis());
	losehp(dam, buf, NO_KILLER_PREFIX);
	iflags.botl = 1;
	return 1;

    } else if ((Fumbling || Glib) && !rn2(5)) {
	pline("The bullwhip slips out of your %s.", body_part(HAND));
	dropx(obj);

    } else if (u.utrap && u.utraptype == TT_PIT) {
	/*
	 *     Assumptions:
	 *
	 *	if you're in a pit
	 *		- you are attempting to get out of the pit
	 *		- or, if you are applying it towards a small
	 *		  monster then it is assumed that you are
	 *		  trying to hit it.
	 *	else if the monster is wielding a weapon
	 *		- you are attempting to disarm a monster
	 *	else
	 *		- you are attempting to hit the monster
	 *
	 *	if you're confused (and thus off the mark)
	 *		- you only end up hitting.
	 *
	 */
	const char *wrapped_what = NULL;

	if (mtmp) {
	    if (bigmonst(mtmp->data)) {
		wrapped_what = strcpy(buf, mon_nam(mtmp));
	    } else if (proficient) {
		if (attack(mtmp, dx, dy)) return 1;
		else pline(msg_snap);
	    }
	}
	if (!wrapped_what) {
	    if (IS_FURNITURE(level->locations[rx][ry].typ))
		wrapped_what = "something";
	    else if (sobj_at(BOULDER, level, rx, ry))
		wrapped_what = "a boulder";
	}
	if (wrapped_what) {
	    coord cc;

	    cc.x = rx; cc.y = ry;
	    pline("You wrap your bullwhip around %s.", wrapped_what);
	    if (proficient && rn2(proficient + 2)) {
		if (!mtmp || enexto(&cc, level, rx, ry, youmonst.data)) {
		    pline("You yank yourself out of the pit!");
		    teleds(cc.x, cc.y, TRUE);
		    u.utrap = 0;
		    vision_full_recalc = 1;
		}
	    } else {
		pline(msg_slipsfree);
	    }
	    if (mtmp) wakeup(mtmp);
	} else pline(msg_snap);

    } else if (mtmp) {
	if (!canspotmon(level, mtmp) &&
		!level->locations[rx][ry].mem_invis) {
	   pline("A monster is there that you couldn't see.");
	   map_invisible(rx, ry);
	}
	otmp = MON_WEP(mtmp);	/* can be null */
	if (otmp) {
	    char onambuf[BUFSZ];
	    const char *mon_hand;
	    boolean gotit = proficient && (!Fumbling || !rn2(10));

	    strcpy(onambuf, cxname(otmp));
	    if (gotit) {
		mon_hand = mbodypart(mtmp, HAND);
		if (bimanual(otmp)) mon_hand = makeplural(mon_hand);
	    } else
		mon_hand = 0;	/* lint suppression */

	    pline("You wrap your bullwhip around %s %s.",
		s_suffix(mon_nam(mtmp)), onambuf);
	    if (gotit && otmp->cursed) {
		pline("%s welded to %s %s%c",
		      (otmp->quan == 1L) ? "It is" : "They are",
		      mhis(level, mtmp), mon_hand,
		      !otmp->bknown ? '!' : '.');
		otmp->bknown = 1;
		gotit = FALSE;	/* can't pull it free */
	    }
	    if (gotit) {
		obj_extract_self(otmp);
		possibly_unwield(mtmp, FALSE);
		setmnotwielded(mtmp,otmp);

		switch (rn2(proficient + 1)) {
		case 2:
		    /* to floor near you */
		    pline("You yank %s %s to the %s!", s_suffix(mon_nam(mtmp)),
			onambuf, surface(u.ux, u.uy));
		    place_object(otmp, level, u.ux, u.uy);
		    stackobj(otmp);
		    break;
		case 3:
		    /* right to you */
		    /* right into your inventory */
		    pline("You snatch %s %s!", s_suffix(mon_nam(mtmp)), onambuf);
		    if (otmp->otyp == CORPSE &&
			    touch_petrifies(&mons[otmp->corpsenm]) &&
			    !uarmg && !Stone_resistance &&
			    !(poly_when_stoned(youmonst.data) &&
				polymon(PM_STONE_GOLEM))) {
			char kbuf[BUFSZ];
			char premsg[BUFSZ];
			sprintf(kbuf, "%s corpse",
				an(mons_mname(&mons[otmp->corpsenm])));
			sprintf(premsg, "Snatching %s is a fatal mistake.", kbuf);
			if (delayed_petrify(premsg, kbuf)) {
			    pline("You drop %s!", doname(otmp));
			    dropy(otmp);
			    break;
			}
		    }
		    hold_another_object(otmp, "You drop %s!",
					       doname(otmp), NULL);
		    break;
		default:
		    /* to floor beneath mon */
		    pline("You yank %s from %s %s!", the(onambuf),
			s_suffix(mon_nam(mtmp)), mon_hand);
		    obj_no_longer_held(otmp);
		    place_object(otmp, level, mtmp->mx, mtmp->my);
		    stackobj(otmp);
		    break;
		}
	    } else {
		pline(msg_slipsfree);
	    }
	    wakeup(mtmp);
	} else {
	    if (mtmp->m_ap_type &&
		!Protection_from_shape_changers && !sensemon(mtmp))
		stumble_onto_mimic(mtmp, dx, dy);
	    else pline("You flick your bullwhip towards %s.", mon_nam(mtmp));
	    if (proficient) {
		if (attack(mtmp, dx, dy))
		    return 1;
		else
		    pline(msg_snap);
	    }
	}

    } else if (Is_airlevel(&u.uz) || Is_waterlevel(&u.uz)) {
	    /* it must be air -- water checked above */
	    pline("You snap your whip through thin air.");

    } else {
	pline(msg_snap);

    }
    return 1;
}